

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_logging.cc
# Opt level: O0

char * __thiscall
google::anon_unknown_6::StaticStringBuf<3000UL>::data(StaticStringBuf<3000UL> *this)

{
  long lVar1;
  long lVar2;
  StaticStringBuf<3000UL> *this_local;
  
  lVar1 = std::streambuf::pptr();
  lVar2 = std::streambuf::pbase();
  if (lVar1 != lVar2) {
    lVar1 = std::streambuf::pptr();
    lVar2 = std::streambuf::epptr();
    if (lVar1 != lVar2) {
      lVar1 = std::streambuf::pptr();
      if (*(char *)(lVar1 + -1) != '\0') {
        std::streambuf::sputc((char)this);
      }
    }
  }
  return this->data_;
}

Assistant:

const char* data() noexcept {
    if (pptr() != pbase() && pptr() != epptr() && *(pptr() - 1) != '\0') {
      sputc('\0');
    }
    return data_;
  }